

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O3

int Rml::FormatString(String *string,char *format,__va_list_tag *argument_list)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  char *__s;
  va_list argument_list_copy;
  char buffer [256];
  undefined8 local_158;
  void *pvStack_150;
  void *local_148;
  char local_138 [264];
  
  local_148 = argument_list->reg_save_area;
  local_158._0_4_ = argument_list->gp_offset;
  local_158._4_4_ = argument_list->fp_offset;
  pvStack_150 = argument_list->overflow_arg_area;
  uVar4 = vsnprintf(local_138,0x100,format,&local_158);
  if ((int)uVar4 < 0) {
LAB_0026451f:
    bVar3 = Assert("Error while formatting string",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/StringUtilities.cpp"
                   ,0x3c);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    uVar4 = 0;
  }
  else {
    __s = local_138;
    if (0xff < uVar4) {
      __s = (char *)operator_new__((ulong)(uVar4 + 1));
      local_148 = argument_list->reg_save_area;
      local_158._0_4_ = argument_list->gp_offset;
      local_158._4_4_ = argument_list->fp_offset;
      pvStack_150 = argument_list->overflow_arg_area;
      uVar4 = vsnprintf(__s,(ulong)(uVar4 + 1),format,&local_158);
      if ((int)uVar4 < 0) goto LAB_0026451f;
    }
    pcVar1 = (char *)string->_M_string_length;
    strlen(__s);
    ::std::__cxx11::string::_M_replace((ulong)string,0,pcVar1,(ulong)__s);
    if (__s != local_138) {
      operator_delete__(__s);
    }
  }
  return uVar4;
}

Assistant:

static int FormatString(String& string, const char* format, va_list argument_list)
{
	constexpr size_t InternalBufferSize = 256;
	char buffer[InternalBufferSize];
	char* buffer_ptr = buffer;

	size_t max_size = InternalBufferSize;
	int length = 0;

	for (int i = 0; i < 2; i++)
	{
		va_list argument_list_copy;
		va_copy(argument_list_copy, argument_list);

		length = vsnprintf(buffer_ptr, max_size, format, argument_list_copy);

		va_end(argument_list_copy);

		if (length < 0)
		{
			RMLUI_ERRORMSG("Error while formatting string");
			return 0;
		}

		if ((size_t)length < max_size || i > 0)
			break;

		max_size = (size_t)length + 1;
		buffer_ptr = new char[max_size];
	}

	string = buffer_ptr;

	if (buffer_ptr != buffer)
		delete[] buffer_ptr;

	return length;
}